

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall
tonk::HostnameResolverState::InitializeResolvedAddressList
          (HostnameResolverState *this,results_type *results)

{
  undefined1 uVar1;
  uint32_t uVar2;
  size_type sVar3;
  PCGRandom *in_RDI;
  PCGRandom prng;
  basic_resolver_entry<asio::ip::tcp> *result;
  const_iterator __end1;
  const_iterator __begin1;
  results_type *__range1;
  basic_resolver_entry<asio::ip::tcp> *in_stack_ffffffffffffff28;
  basic_resolver_entry<asio::ip::tcp> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  PCGRandom local_b0;
  basic_resolver_results<asio::ip::tcp> *in_stack_ffffffffffffff68;
  vector<asio::ip::address,_std::allocator<asio::ip::address>_> *in_stack_ffffffffffffff70;
  
  std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::clear
            ((vector<asio::ip::address,_std::allocator<asio::ip::address>_> *)0x1305f2);
  asio::ip::basic_resolver_results<asio::ip::tcp>::size
            ((basic_resolver_results<asio::ip::tcp> *)0x1305ff);
  std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::reserve
            (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  asio::ip::basic_resolver_results<asio::ip::tcp>::begin(in_stack_ffffffffffffff68);
  asio::ip::basic_resolver_results<asio::ip::tcp>::end
            ((basic_resolver_results<asio::ip::tcp> *)in_stack_ffffffffffffff28);
  while( true ) {
    uVar1 = asio::ip::operator!=
                      ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_ffffffffffffff30,
                       (basic_resolver_iterator<asio::ip::tcp> *)in_stack_ffffffffffffff28);
    if (!(bool)uVar1) break;
    in_stack_ffffffffffffff30 =
         asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                   ((basic_resolver_iterator<asio::ip::tcp> *)0x1306d7);
    in_stack_ffffffffffffff28 = (basic_resolver_entry<asio::ip::tcp> *)(in_RDI + 1);
    asio::ip::basic_resolver_entry<asio::ip::tcp>::endpoint(in_stack_ffffffffffffff28);
    asio::ip::basic_endpoint<asio::ip::tcp>::address(&in_stack_ffffffffffffff28->endpoint_);
    std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::
    emplace_back<asio::ip::address>
              ((vector<asio::ip::address,_std::allocator<asio::ip::address>_> *)in_RDI,
               (address *)CONCAT17(uVar1,in_stack_ffffffffffffff38));
    asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator++
              ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_ffffffffffffff30);
  }
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x13067c);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x130689);
  sVar3 = std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::size
                    ((vector<asio::ip::address,_std::allocator<asio::ip::address>_> *)(in_RDI + 1));
  *(int *)((long)&in_RDI[2].Inc + 4) = (int)sVar3;
  siamese::PCGRandom::PCGRandom(&local_b0);
  siamese::GetTimeUsec();
  siamese::PCGRandom::Seed
            (in_RDI,CONCAT17(uVar1,in_stack_ffffffffffffff38),(uint64_t)in_stack_ffffffffffffff30);
  uVar2 = siamese::PCGRandom::Next(&local_b0);
  *(uint *)&in_RDI[2].Inc = uVar2 % *(uint *)((long)&in_RDI[2].Inc + 4);
  return;
}

Assistant:

void HostnameResolverState::InitializeResolvedAddressList(
    const asio::ip::tcp::resolver::results_type& results)
{
    // Copy the resolved addresses
    ResolvedIPAddresses.clear();
    ResolvedIPAddresses.reserve(results.size());
    for (const auto& result : results) {
        ResolvedIPAddresses.emplace_back(result.endpoint().address());
    }
    ConnectRequestsRemaining = (unsigned)ResolvedIPAddresses.size();

    // Select the first address to connect to at random
    siamese::PCGRandom prng;
    prng.Seed(siamese::GetTimeUsec());
    ConnectAddrIndex = static_cast<int>(prng.Next() % ConnectRequestsRemaining);
}